

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

ssize_t tnt_io_recv(tnt_stream_net *s,char *buf,size_t size)

{
  size_t *psVar1;
  size_t sVar2;
  char *buf_00;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  long lVar6;
  size_t __n;
  size_t __n_00;
  long lVar7;
  
  if ((s->rbuf).buf == (char *)0x0) {
    sVar4 = tnt_io_recv_raw(s,buf,size,1);
    return sVar4;
  }
  sVar3 = (s->rbuf).top;
  lVar6 = 0;
  __n = size;
  while( true ) {
    sVar2 = (s->rbuf).off;
    if (sVar2 + __n <= sVar3) {
      memcpy(buf + lVar6,(s->rbuf).buf + sVar2,__n);
      psVar1 = &(s->rbuf).off;
      *psVar1 = *psVar1 + __n;
      return size;
    }
    lVar7 = sVar3 - sVar2;
    buf_00 = (s->rbuf).buf;
    __n_00 = sVar3 - sVar2;
    if (__n_00 != 0) {
      memcpy(buf + lVar6,buf_00 + sVar2,__n_00);
      lVar6 = lVar6 + __n_00;
      buf_00 = (s->rbuf).buf;
    }
    (s->rbuf).off = 0;
    sVar3 = tnt_io_recv_raw(s,buf_00,(s->rbuf).size,0);
    if ((long)sVar3 < 1) break;
    __n = __n - lVar7;
    (s->rbuf).top = sVar3;
    if (__n <= sVar3) {
      memcpy(buf + lVar6,(s->rbuf).buf,__n);
      (s->rbuf).off = __n;
      return size;
    }
  }
  piVar5 = __errno_location();
  s->errno_ = *piVar5;
  s->error = TNT_ESYSTEM;
  return -1;
}

Assistant:

ssize_t
tnt_io_recv(struct tnt_stream_net *s, char *buf, size_t size)
{
	if (s->rbuf.buf == NULL)
		return tnt_io_recv_raw(s, buf, size, 1);
	size_t lv, rv, off = 0, left = size;
	while (1) {
		if ((s->rbuf.off + left) <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, left);
			s->rbuf.off += left;
			return size;
		}

		lv = s->rbuf.top - s->rbuf.off;
		rv = left - lv;
		if (lv) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, lv);
			off += lv;
		}

		s->rbuf.off = 0;
		ssize_t top = tnt_io_recv_raw(s, s->rbuf.buf, s->rbuf.size, 0);
		if (top <= 0) {
			s->errno_ = errno;
			s->error = TNT_ESYSTEM;
			return -1;
		}

		s->rbuf.top = top;
		if (rv <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf, rv);
			s->rbuf.off = rv;
			return size;
		}
		left -= lv;
	}
	return -1;
}